

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_sequence_containers.h
# Opt level: O2

output_type *
testinator::Arbitrary<std::__cxx11::list<int,_std::allocator<int>_>_>::generate
          (output_type *__return_storage_ptr__,size_t generation,unsigned_long randomSeed)

{
  anon_class_16_2_2856ea55 __gen;
  unsigned_long randomSeed_local;
  size_t generation_local;
  
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size = 0;
  if (generation != 0) {
    __gen.randomSeed = &randomSeed_local;
    __gen.generation = &generation_local;
    randomSeed_local = randomSeed;
    generation_local = generation;
    ::std::
    generate_n<std::back_insert_iterator<std::__cxx11::list<int,std::allocator<int>>>,unsigned_long,testinator::Arbitrary<std::__cxx11::list<int,std::allocator<int>>>::generate(unsigned_long,unsigned_long)::_lambda()_1_>
              ((back_insert_iterator<std::__cxx11::list<int,_std::allocator<int>_>_>)
               __return_storage_ptr__,(generation / 100) * 5 + 5,__gen);
  }
  return __return_storage_ptr__;
}

Assistant:

static output_type generate(std::size_t generation, unsigned long int randomSeed)
    {
      output_type v;
      if (generation == 0) return v;
      std::size_t n = N * ((generation / 100) + 1);
      std::generate_n(std::back_inserter(v), n,
                      [&] () { return Arbitrary<T>::generate(generation++, randomSeed++); });
      return v;
    }